

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O0

Dim * __thiscall
cnn::Average::dim_forward(Average *this,vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  bool bVar1;
  const_reference pvVar2;
  ulong uVar3;
  size_type sVar4;
  ostream *os;
  invalid_argument *this_00;
  uint *puVar5;
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *in_RDX;
  Dim *in_RDI;
  Dim *d;
  ostringstream s;
  uint i;
  Dim *in_stack_fffffffffffffdb8;
  Dim *in_stack_fffffffffffffdc0;
  ostringstream *this_01;
  string local_208 [48];
  ostringstream local_1d8 [452];
  uint local_14;
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *local_10;
  
  local_10 = in_RDX;
  pvVar2 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](in_RDX,0);
  memcpy(in_RDI,pvVar2,0x24);
  local_14 = 1;
  while( true ) {
    uVar3 = (ulong)local_14;
    sVar4 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::size(local_10);
    if (sVar4 <= uVar3) {
      return in_RDI;
    }
    std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,0);
    Dim::single_batch(in_stack_fffffffffffffdc0);
    std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,1);
    Dim::single_batch(in_stack_fffffffffffffdc0);
    bVar1 = cnn::operator!=(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    if (bVar1) break;
    pvVar2 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,(ulong)local_14);
    puVar5 = std::max<unsigned_int>(&pvVar2->bd,&in_RDI->bd);
    in_RDI->bd = *puVar5;
    local_14 = local_14 + 1;
  }
  this_01 = local_1d8;
  std::__cxx11::ostringstream::ostringstream(this_01);
  os = std::operator<<((ostream *)this_01,"Mismatched input dimensions in Average: ");
  cnn::operator<<(os,(vector<cnn::Dim,_std::allocator<cnn::Dim>_> *)this_01);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::invalid_argument::invalid_argument(this_00,local_208);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim Average::dim_forward(const vector<Dim>& xs) const {
  Dim d(xs[0]);
  for (unsigned i = 1; i < xs.size(); ++i) {
    if (xs[0].single_batch() != xs[1].single_batch()) {
      ostringstream s; s << "Mismatched input dimensions in Average: " << xs;
      throw std::invalid_argument(s.str());
    }
    d.bd = max(xs[i].bd, d.bd);
  }
  return d;
}